

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

char * SQCompilation::opname(SQInteger op)

{
  SQInteger op_local;
  char *local_8;
  
  if (op == 0x2e) {
    local_8 = ".";
  }
  else if (op == 0x146) {
    local_8 = "?.";
  }
  else if (op == 0x155) {
    local_8 = ".$";
  }
  else if (op == 0x156) {
    local_8 = "?.$";
  }
  else {
    local_8 = "<unknown>";
  }
  return local_8;
}

Assistant:

static const char *opname(SQInteger op) {
  switch (op)
  {
    case _SC('.'): return ".";
    case TK_NULLGETSTR: return "?.";
    case TK_TYPE_METHOD_GETSTR: return ".$";
    case TK_NULLABLE_TYPE_METHOD_GETSTR: return "?.$";
    default: return "<unknown>";
  }
}